

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

FieldDescriptor * google::protobuf::compiler::java::MapValueField(FieldDescriptor *descriptor)

{
  Descriptor *this;
  FieldDescriptor *pFVar1;
  Nonnull<const_char_*> pcVar2;
  java ajStack_18 [16];
  
  if ((ulong)descriptor->type_ == 0xb) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0xb,(ulong)descriptor->type_,
                        "FieldDescriptor::TYPE_MESSAGE == descriptor->type()");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    this = FieldDescriptor::message_type(descriptor);
    if ((this->options_->field_0)._impl_.map_entry_ != false) {
      pFVar1 = Descriptor::map_value(this);
      return pFVar1;
    }
    MapValueField(ajStack_18);
  }
  MapValueField();
}

Assistant:

const FieldDescriptor* MapValueField(const FieldDescriptor* descriptor) {
  ABSL_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  ABSL_CHECK(message->options().map_entry());
  return message->map_value();
}